

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>> *this,
          Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *essential,Scalar *tau,
          Scalar *workspace)

{
  ulong uVar1;
  Nested *ppMVar2;
  double dVar3;
  ulong uVar4;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *pBVar5;
  double *pdVar6;
  long lVar7;
  char *__function;
  Index row;
  scalar_product_op<double,_double> *row_00;
  variable_if_dynamic<long,__1> *pvVar8;
  scalar_product_op<double,_double> *psVar9;
  long *plVar10;
  Index innerSize;
  Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp_1;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  tmp_3;
  SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
  tmp;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false> right;
  scalar_difference_op<double> local_1c9;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>> *local_1c8;
  Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *local_1c0;
  double *local_1b8;
  undefined1 local_1b0 [24];
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>
  local_198;
  undefined1 local_188 [32];
  variable_if_dynamic<long,__1> vStack_168;
  variable_if_dynamic<long,__1> local_160;
  Nested pMStack_158;
  Nested local_150;
  Nested pMStack_148;
  Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> local_140;
  DenseIndex local_118;
  DenseIndex DStack_110;
  undefined8 local_108;
  undefined1 local_f8 [16];
  scalar_product_op<double,_double> *local_e8;
  scalar_multiple_op<double> local_e0;
  PointerType local_d8;
  long lStack_d0;
  Nested local_c0;
  Index IStack_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false> local_78;
  
  lVar7 = *(long *)(this + 0x10);
  if (lVar7 == 1) {
    local_188._16_8_ = 1.0 - *tau;
    local_f8._8_8_ = (scalar_product_op<double,_double> *)local_188;
    local_f8._0_8_ = this;
    local_188._8_8_ = 4.94065645841247e-324;
    local_188._0_8_ = *(double *)(this + 8);
    if (-1 < (long)*(double *)(this + 8)) {
      SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_2,_2>_>_>
      ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
                   *)local_f8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>
                   *)local_188);
      return;
    }
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 2, 2>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 0, 2, 2>]"
                 );
  }
  psVar9 = *(scalar_product_op<double,_double> **)(this + 8);
  local_1b8 = tau;
  local_1b0._0_8_ = workspace;
  local_1b0._8_8_ = psVar9;
  if ((long)psVar9 < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                  ,0x8a,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1, 0, 2, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1, 0, 2, 1>>, Level = 0]"
                 );
  }
  uVar1 = lVar7 - 1;
  uVar4 = *(ulong *)this;
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_data = (PointerType)(*(long *)(this + 0x20) * 8 + uVar4);
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value = (long)psVar9;
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = uVar1;
  if ((long)((ulong)psVar9 | uVar1) < 0 &&
      local_78.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_data != (PointerType)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Level = 0]"
    ;
    goto LAB_00128b71;
  }
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_cols.m_value
       = *(long *)(this + 0x10);
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.m_xpr =
       *(Nested *)(this + 0x18);
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_data =
       *(PointerType *)this;
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_rows.m_value
       = *(long *)(this + 8);
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.m_outerStride =
       *(Index *)(this + 0x20);
  local_78.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
  .m_outerStride = *(Index *)(this + 0x20);
  if (lVar7 < 1) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  pvVar8 = (variable_if_dynamic<long,__1> *)&local_78;
  plVar10 = (long *)local_188;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *plVar10 = pvVar8->m_value;
    pvVar8 = pvVar8 + 1;
    plVar10 = plVar10 + 1;
  }
  local_140.super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_data =
       (essential->
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
       m_data;
  local_140.super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_rows.
  m_value = (essential->
            super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>)
            .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
            .m_rows.m_value;
  local_140.super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr =
       (essential->
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr;
  local_140.super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  m_outerStride =
       (essential->
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
       m_outerStride;
  local_108 = 0;
  if (uVar1 != (essential->
               super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
               .m_rows.m_value) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                  ,0x9e,
                  "Eigen::CoeffBasedProduct<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, 6>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, NestingFlags = 6, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>]"
                 );
  }
  if (psVar9 != (scalar_product_op<double,_double> *)local_188._8_8_) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double, -1, 1, 0, 2, 1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1, 0, 2, 1>>, OtherDerived = Eigen::CoeffBasedProduct<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, 6>]"
                 );
  }
  if (psVar9 == (scalar_product_op<double,_double> *)0x0) {
    local_188._8_8_ = 0;
    local_188._0_8_ = uVar4;
LAB_00128890:
    pdVar6 = local_1b8;
    local_188._24_8_ = *(undefined8 *)this;
    vStack_168.m_value = *(long *)(this + 8);
    local_160.m_value = *(long *)(this + 0x10);
    pMStack_158 = *(Nested *)(this + 0x18);
    local_150 = *(Nested *)(this + 0x20);
    pMStack_148 = local_150;
    if (*(long *)(this + 0x10) < 1) {
LAB_00128ae8:
      local_150 = pMStack_148;
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                    ,0x76,
                    "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    local_f8._0_8_ = local_1b0;
    local_f8._8_8_ = local_1b0 + 0x18;
    SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>_>
    ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>_>
                 *)local_f8,
                (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>
                 *)local_188);
    local_e0.m_other = *pdVar6;
    local_f8._8_8_ = local_1b0._8_8_;
    local_f8._0_8_ = local_1b0._0_8_;
    local_188._0_16_ = *(undefined1 (*) [16])this;
    if (-1 < *(long *)(this + 8) || *(long *)this == 0) {
      local_188._24_8_ = *(undefined8 *)this;
      vStack_168.m_value = *(long *)(this + 8);
      local_160.m_value = *(long *)(this + 0x10);
      pMStack_158 = *(Nested *)(this + 0x18);
      local_150 = *(Nested *)(this + 0x20);
      pMStack_148 = local_150;
      if (0 < *(long *)(this + 0x10)) {
        local_198.m_matrix =
             (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>
              *)local_188;
        local_198.m_functor = &local_1c9;
        SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)(local_1b0 + 0x18),
                    (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)local_f8);
        dVar3 = *pdVar6;
        local_e8 = (scalar_product_op<double,_double> *)local_1b0._8_8_;
        if ((scalar_product_op<double,_double> *)0x2 < (ulong)local_1b0._8_8_) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                        ,0xf1,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 2, 1>]"
                       );
        }
        ppMVar2 = &(essential->
                   super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                   .m_xpr;
        if ((scalar_product_op<double,_double> *)local_1b0._8_8_ ==
            (scalar_product_op<double,_double> *)0x0) {
          local_d8 = (essential->
                     super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                     .m_data;
          lStack_d0 = (essential->
                      super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                      ).
                      super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                      .m_rows.m_value;
          local_c0 = *ppMVar2;
          IStack_b8 = (essential->
                      super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                      ).
                      super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                      .m_outerStride;
          local_88 = 0;
          uStack_80 = 0;
          local_188._16_8_ = (scalar_product_op<double,_double> *)0x0;
        }
        else {
          if ((scalar_product_op<double,_double> *)local_1b0._8_8_ ==
              (scalar_product_op<double,_double> *)0x2) {
            pBVar5 = (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)
                     (dVar3 * (double)(((BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                                         *)local_1b0._0_8_)->
                                      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>
                                      ).
                                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                                      .
                                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
                                      .m_data);
            psVar9 = (scalar_product_op<double,_double> *)
                     (dVar3 * (double)(((BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                                         *)local_1b0._0_8_)->
                                      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>
                                      ).
                                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                                      .
                                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
                                      .m_rows.m_value);
            local_f8._8_4_ = (int)psVar9;
            local_f8._0_8_ = pBVar5;
            local_f8._12_4_ = (int)((ulong)psVar9 >> 0x20);
            local_d8 = (essential->
                       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                       .m_data;
            lStack_d0 = (essential->
                        super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                        ).
                        super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                        .m_rows.m_value;
            local_c0 = *ppMVar2;
            IStack_b8 = (essential->
                        super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                        ).
                        super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                        .m_outerStride;
            local_188._16_8_ = (scalar_product_op<double,_double> *)0x2;
          }
          else {
            psVar9 = (scalar_product_op<double,_double> *)0x0;
            do {
              *(double *)(local_f8 + (long)psVar9 * 8) =
                   (double)(&(((BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                                *)local_1b0._0_8_)->
                             super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>
                             ).
                             super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                             .
                             super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
                             .m_data)[(long)psVar9] * dVar3;
              psVar9 = psVar9 + 1;
            } while ((scalar_product_op<double,_double> *)local_1b0._8_8_ != psVar9);
            local_d8 = (essential->
                       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                       .m_data;
            lStack_d0 = (essential->
                        super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                        ).
                        super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
                        .m_rows.m_value;
            local_c0 = *ppMVar2;
            IStack_b8 = (essential->
                        super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                        ).
                        super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                        .m_outerStride;
            local_88 = 0;
            uStack_80 = 0;
            local_188._16_8_ = local_1b0._8_8_;
            if ((scalar_product_op<double,_double> *)local_1b0._8_8_ !=
                (scalar_product_op<double,_double> *)0x2) {
              memcpy(local_188,local_f8,local_1b0._8_8_ << 3);
              goto LAB_00128a9e;
            }
            pBVar5 = (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)local_f8._0_8_;
            psVar9 = (scalar_product_op<double,_double> *)local_f8._8_8_;
          }
          uStack_80 = 0;
          local_88 = 0;
          local_188._8_4_ = (int)psVar9;
          local_188._0_8_ = pBVar5;
          local_188._12_4_ = (int)((ulong)psVar9 >> 0x20);
        }
LAB_00128a9e:
        vStack_168.m_value = (long)local_d8;
        local_160.m_value = lStack_d0;
        local_150 = local_c0;
        pMStack_148 = (Nested)IStack_b8;
        local_118 = 0;
        DStack_110 = 0;
        local_198.m_matrix = &local_78;
        local_198.m_functor = &local_1c9;
        SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_256>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>
                     *)(local_1b0 + 0x18),
                    (CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>
                     *)local_188);
        return;
      }
      goto LAB_00128ae8;
    }
  }
  else {
    row_00 = (scalar_product_op<double,_double> *)0x0;
    local_1c8 = this;
    local_1c0 = essential;
    do {
      internal::
      product_coeff_impl<0,_-1,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>,_double>
      ::run((Index)row_00,0,
            (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>
             *)local_188,&local_140,(double *)local_f8);
      workspace[(long)row_00] = (Scalar)local_f8._0_8_;
      row_00 = row_00 + 1;
    } while (psVar9 != row_00);
    local_188._0_16_ = *(undefined1 (*) [16])local_1c8;
    this = local_1c8;
    essential = local_1c0;
    if (-1 < *(long *)(local_1c8 + 8) || *(long *)local_1c8 == 0) goto LAB_00128890;
  }
  __function = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>, -1, 1, true>, Level = 0]"
  ;
LAB_00128b71:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                ,0x94,__function);
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}